

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinputsimulatorimpllinux.cpp
# Opt level: O3

void __thiscall XInputSimulatorImplLinux::mouseMoveTo(XInputSimulatorImplLinux *this,int x,int y)

{
  input_event ev_sync;
  input_event ev [2];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  int iStack_34;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined4 uStack_20;
  int iStack_1c;
  
  if (this->display != (Display *)0x0) {
    uStack_30 = 0;
    local_28 = 0;
    local_48 = 0;
    uStack_40 = 0;
    local_68 = 0;
    uStack_60 = 0;
    _local_38 = CONCAT44(x,3);
    _uStack_20 = CONCAT44(y,0x10003);
    write(this->fd,&local_48,0x30);
    local_58 = 0;
    write(this->fd,&local_68,0x18);
  }
  return;
}

Assistant:

void XInputSimulatorImplLinux::mouseMoveTo(int x, int y)
{
    if(!display){
        return;
    }

    struct input_event ev[2], ev_sync;
    memset(ev, 0, sizeof(ev));
    memset(&ev_sync, 0, sizeof(ev_sync));

    ev[0].type = EV_ABS;
    ev[0].code = ABS_X;
    ev[0].value = x;
    ev[1].type = EV_ABS;
    ev[1].code = ABS_Y;
    ev[1].value = y;


    int res_w = write(fd, ev, sizeof(ev));

    ev_sync.type = EV_SYN;
    ev_sync.value = 0;
    ev_sync.code = 0;
    int res_ev_sync = write(fd, &ev_sync, sizeof(ev_sync));

  /*  XWarpPointer(display, None, root, 0, 0, 0, 0, x, y);
    XFlush(display);


    XEvent event;
    memset(&event, 0, sizeof (event));*/
}